

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O2

char * stringcache(StringCache *cache,char *str)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong uVar6;
  undefined8 *puVar7;
  char *__s1;
  long *plVar8;
  ulong __n;
  
  sVar3 = strlen(str);
  __n = sVar3 & 0xffffffff;
  uVar1 = 0x1505;
  for (uVar6 = 0; __n != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = (uint)(byte)str[uVar6] ^ uVar1 * 0x21;
  }
  plVar8 = (long *)((ulong)((uVar1 & cache->table_size - 1 & 0xff) << 3) + (long)cache->hashtable);
  plVar4 = plVar8;
  puVar7 = (undefined8 *)0x0;
  do {
    puVar5 = (undefined8 *)*plVar4;
    if (puVar5 == (undefined8 *)0x0) {
      puVar5 = (undefined8 *)malloc(__n + 0x11);
      if (puVar5 == (undefined8 *)0x0) {
        __s1 = (char *)0x0;
      }
      else {
        __s1 = (char *)(puVar5 + 2);
        *puVar5 = __s1;
        memcpy(__s1,str,__n);
        *(undefined1 *)((long)puVar5 + __n + 0x10) = 0;
LAB_0010abb1:
        puVar5[1] = *plVar8;
        *plVar8 = (long)puVar5;
      }
      return __s1;
    }
    __s1 = (char *)*puVar5;
    iVar2 = strncmp(__s1,str,__n);
    if ((iVar2 == 0) && (__s1[__n] == '\0')) {
      if (puVar7 == (undefined8 *)0x0) {
        return __s1;
      }
      if ((undefined8 *)puVar7[1] != puVar5) {
        __assert_fail("prev->next == bucket",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/icculus[P]altrace/altrace_common.c"
                      ,0xec,
                      "const char *stringcache_len_internal(StringCache *, const char *, const unsigned int, const int)"
                     );
      }
      puVar7[1] = puVar5[1];
      goto LAB_0010abb1;
    }
    plVar4 = puVar5 + 1;
    puVar7 = puVar5;
  } while( true );
}

Assistant:

const char *stringcache(StringCache *cache, const char *str)
{
    return stringcache_len(cache, str, strlen(str));
}